

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_loshelf2_init(ma_loshelf2_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks
                          ,ma_loshelf2 *pFilter)

{
  ma_result mVar1;
  void *pHeap;
  size_t heapSizeInBytes;
  size_t local_30;
  
  mVar1 = ma_loshelf2_get_heap_size(pConfig,&local_30);
  if (mVar1 != MA_SUCCESS) {
    return mVar1;
  }
  if (local_30 == 0) {
    pHeap = (void *)0x0;
LAB_0015c361:
    mVar1 = ma_loshelf2_init_preallocated(pConfig,pHeap,pFilter);
    if (mVar1 == MA_SUCCESS) {
      (pFilter->bq)._ownsHeap = 1;
      mVar1 = MA_SUCCESS;
    }
    else {
      ma_free(pHeap,pAllocationCallbacks);
    }
  }
  else {
    if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      pHeap = malloc(local_30);
LAB_0015c359:
      if (pHeap != (void *)0x0) goto LAB_0015c361;
    }
    else if (pAllocationCallbacks->onMalloc != (_func_void_ptr_size_t_void_ptr *)0x0) {
      pHeap = (*pAllocationCallbacks->onMalloc)(local_30,pAllocationCallbacks->pUserData);
      goto LAB_0015c359;
    }
    mVar1 = MA_OUT_OF_MEMORY;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_loshelf2_init(const ma_loshelf2_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_loshelf2* pFilter)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_loshelf2_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_loshelf2_init_preallocated(pConfig, pHeap, pFilter);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pFilter->bq._ownsHeap = MA_TRUE;    /* <-- This will cause the biquad to take ownership of the heap and free it when it's uninitialized. */
    return MA_SUCCESS;
}